

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

char * Abc_SopCreateAnd(Mem_Flex_t *pMan,int nVars,int *pfCompl)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  
  pcVar1 = Abc_SopStart(pMan,1,nVars);
  uVar2 = 0;
  uVar3 = 0;
  if (0 < nVars) {
    uVar3 = (ulong)(uint)nVars;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    cVar4 = '1';
    if (pfCompl != (int *)0x0) {
      cVar4 = '1' - (char)pfCompl[uVar2];
    }
    pcVar1[uVar2] = cVar4;
  }
  pcVar1[(long)nVars + 1] = '1';
  return pcVar1;
}

Assistant:

char * Abc_SopCreateAnd( Mem_Flex_t * pMan, int nVars, int * pfCompl )
{
    char * pSop;
    int i;
    pSop = Abc_SopStart( pMan, 1, nVars );
    for ( i = 0; i < nVars; i++ )
        pSop[i] = '1' - (pfCompl? pfCompl[i] : 0);
    pSop[nVars + 1] = '1';
    return pSop;
}